

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

SN_ELEMENT * __thiscall
ON_SerialNumberMap::AddSerialNumberAndId(ON_SerialNumberMap *this,ON__UINT64 sn,ON_UUID id)

{
  long lVar1;
  SN_ELEMENT **ppSVar2;
  ON__UINT32 id_crc32;
  SN_ELEMENT *pSVar3;
  SN_ELEMENT *pSVar4;
  uint uVar5;
  ON__UINT64 *p;
  bool bVar6;
  ON_UUID local_38;
  
  local_38 = id;
  pSVar3 = AddSerialNumber(this,sn);
  if ((pSVar3 != (SN_ELEMENT *)0x0) && (pSVar3->m_id_active == '\0')) {
    id_crc32 = 0;
    bVar6 = local_38.Data4 == (uchar  [8])0x0 && local_38._0_8_ == 0;
    if (local_38.Data4 != (uchar  [8])0x0 || local_38._0_8_ != 0) {
      id_crc32 = ON_CRC32(0,0x10,&local_38);
      lVar1._0_4_ = (this->m_inactive_id).Data1;
      lVar1._4_2_ = (this->m_inactive_id).Data2;
      lVar1._6_2_ = (this->m_inactive_id).Data3;
      if ((lVar1 == local_38._0_8_) && (*&(this->m_inactive_id).Data4 == local_38.Data4)) {
        (this->m_inactive_id).Data1 = 0;
        (this->m_inactive_id).Data2 = 0;
        (this->m_inactive_id).Data3 = 0;
        (this->m_inactive_id).Data4[0] = '\0';
        (this->m_inactive_id).Data4[1] = '\0';
        (this->m_inactive_id).Data4[2] = '\0';
        (this->m_inactive_id).Data4[3] = '\0';
        (this->m_inactive_id).Data4[4] = '\0';
        (this->m_inactive_id).Data4[5] = '\0';
        (this->m_inactive_id).Data4[6] = '\0';
        (this->m_inactive_id).Data4[7] = '\0';
      }
      else if (this->m_active_id_count != 0) {
        pSVar4 = Internal_HashTableFindId(this,local_38,id_crc32,true);
        bVar6 = bVar6 || pSVar4 != (SN_ELEMENT *)0x0;
      }
    }
    if (bVar6) {
      local_38 = ON_CreateId();
      id_crc32 = ON_CRC32(0,0x10,&local_38);
    }
    if (this->m_bHashTableIsValid != '\0') {
      Internal_HashTableGrow(this);
      ppSVar2 = this->m_hash_table_blocks[(ulong)id_crc32 % (ulong)this->m_hash_block_count];
      uVar5 = id_crc32 / 0xffa + (id_crc32 / 0xff4024) * -0xffa;
      pSVar3->m_next = ppSVar2[uVar5];
      ppSVar2[uVar5] = pSVar3;
    }
    (pSVar3->m_id).Data1 = local_38.Data1;
    (pSVar3->m_id).Data2 = local_38.Data2;
    (pSVar3->m_id).Data3 = local_38.Data3;
    *&(pSVar3->m_id).Data4 = local_38.Data4;
    pSVar3->m_id_active = '\x01';
    pSVar3->m_id_crc32 = id_crc32;
    this->m_active_id_count = this->m_active_id_count + 1;
  }
  return pSVar3;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::AddSerialNumberAndId(ON__UINT64 sn,ON_UUID id)
{
  struct SN_ELEMENT* e = AddSerialNumber(sn);

  if (nullptr == e || 0 != e->m_id_active)
  {
    // There was an active element with serial number = sn
    return e;
  }
  
  ON__UINT32 id_crc32 = 0;

  bool bNewId = IdIsNil(&id);
  if ( false == bNewId )
  {
    id_crc32 = IdCRC32(&id);
    if (IdIsEqual(&m_inactive_id, &id))
    {
      // This id was recently removed and is now being added back
      // (which turns out to be a common occurrence - go figure).
      // No need to check for duplicates.
      m_inactive_id = ON_nil_uuid;
    }
    else if (m_active_id_count > 0)
    {
      if (nullptr != Internal_HashTableFindId(id, id_crc32, true))
        bNewId = true; // id is in use - make a new one
    }
  }

  if ( bNewId )
  {
    // The input id is nil or in use. Create a new id. No need to check for duplicates
    id = ON_CreateId();
    id_crc32 = IdCRC32(&id);
  }

  if (m_bHashTableIsValid)
  {
    // Growing must happen vefore e->m_id* values are set.
    Internal_HashTableGrow();

    // Add id to hash table
    struct SN_ELEMENT** hash_table_block = Internal_HashTableBlock(id_crc32);
    const ON__UINT32 hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(id_crc32);
    e->m_next = hash_table_block[hash_i];
    hash_table_block[hash_i] = e;
  }
  
  // e->m_id and related setting must be initialized after any
  // possible calls to Internal_HashTableGrow() to prevent add
  // e twice.
  e->m_id = id;
  e->m_id_active = 1;
  e->m_id_crc32 = id_crc32;
  m_active_id_count++;

  return e;
}